

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitIf(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
        *this,IfExpr e)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  int precedence;
  ExprBase e_00;
  ExprBase e_01;
  
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 3;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  pcVar3[sVar4 + 2] = ' ';
  pcVar3 = pcVar3 + sVar4;
  pcVar3[0] = 'i';
  pcVar3[1] = 'f';
  pBVar2->size_ = uVar1;
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_ +
             8))->impl_,0);
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 6;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4," then ",6);
  pBVar2->size_ = uVar1;
  e_01.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.
                                super_ExprBase.impl_ + 0x18);
  if ((e_01.impl_)->kind_ == FIRST_EXPR) {
    e_00.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.
                                  super_ExprBase.impl_ + 0x10);
    if ((*(double *)(e_01.impl_ + 2) == 0.0) && (!NAN(*(double *)(e_01.impl_ + 2)))) {
      precedence = 1;
      e_01.impl_ = e_00.impl_;
      goto LAB_0033f8e4;
    }
  }
  else {
    e_00.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.
                                  super_ExprBase.impl_ + 0x10);
  }
  Visit(this,(NumericExpr)e_00.impl_,2);
  pBVar2 = this->writer_->buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 6;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4," else ",6);
  pBVar2->size_ = uVar1;
  precedence = -1;
LAB_0033f8e4:
  Visit(this,(NumericExpr)e_01.impl_,precedence);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIf(IfExpr e) {
  writer_ << "if ";
  Visit(e.condition(), prec::UNKNOWN);
  writer_ << " then ";
  NumericExpr else_expr = e.else_expr();
  bool has_else = !IsZero<ExprTypes>(else_expr);
  Visit(e.then_expr(), prec::CONDITIONAL + (has_else ? 1 : 0));
  if (has_else) {
    writer_ << " else ";
    Visit(else_expr);
  }
}